

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReaderMgr.cpp
# Opt level: O1

XMLReader * __thiscall
xercesc_4_0::ReaderMgr::createReader
          (ReaderMgr *this,InputSource *src,bool param_2,RefFrom refFrom,Types type,Sources source,
          bool calcSrcOfs,XMLSize_t lowWaterMark)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  XMLCh *encodingStr;
  undefined4 extraout_var_01;
  XMLReader *this_00;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined7 in_register_00000011;
  BinInputStream *streamToAdopt;
  undefined4 extraout_var_00;
  
  iVar2 = (*src->_vptr_InputSource[2])(src,src,CONCAT71(in_register_00000011,param_2));
  streamToAdopt = (BinInputStream *)CONCAT44(extraout_var,iVar2);
  if (streamToAdopt == (BinInputStream *)0x0) {
    this_00 = (XMLReader *)0x0;
  }
  else {
    iVar2 = (*src->_vptr_InputSource[3])(src);
    encodingStr = (XMLCh *)CONCAT44(extraout_var_00,iVar2);
    if (encodingStr == (XMLCh *)0x0) {
      iVar2 = (*streamToAdopt->_vptr_BinInputStream[5])(streamToAdopt);
      encodingStr = (XMLCh *)CONCAT44(extraout_var_01,iVar2);
    }
    if (encodingStr == (XMLCh *)0x0) {
      this_00 = (XMLReader *)XMemory::operator_new(0x280c0,this->fMemoryManager);
      iVar2 = (*src->_vptr_InputSource[4])(src);
      iVar3 = (*src->_vptr_InputSource[5])(src);
      XMLReader::XMLReader
                (this_00,(XMLCh *)CONCAT44(extraout_var_04,iVar2),
                 (XMLCh *)CONCAT44(extraout_var_05,iVar3),streamToAdopt,refFrom,type,source,false,
                 calcSrcOfs,lowWaterMark,this->fXMLVersion,this->fMemoryManager);
    }
    else {
      this_00 = (XMLReader *)XMemory::operator_new(0x280c0,this->fMemoryManager);
      iVar2 = (*src->_vptr_InputSource[4])(src);
      iVar3 = (*src->_vptr_InputSource[5])(src);
      XMLReader::XMLReader
                (this_00,(XMLCh *)CONCAT44(extraout_var_02,iVar2),
                 (XMLCh *)CONCAT44(extraout_var_03,iVar3),streamToAdopt,encodingStr,refFrom,type,
                 source,false,calcSrcOfs,lowWaterMark,this->fXMLVersion,this->fMemoryManager);
    }
    uVar1 = this->fNextReaderNum;
    this->fNextReaderNum = uVar1 + 1;
    this_00->fReaderNum = (ulong)uVar1;
  }
  return this_00;
}

Assistant:

XMLReader* ReaderMgr::createReader( const   InputSource&        src
                                    , const bool
                                    , const XMLReader::RefFrom  refFrom
                                    , const XMLReader::Types    type
                                    , const XMLReader::Sources  source
                                    , const bool                calcSrcOfs
                                    ,       XMLSize_t           lowWaterMark)
{
    //
    //  Ask the input source to create us an input stream. The particular
    //  type of input source will know what kind to create.
    //
    BinInputStream* newStream = src.makeStream();
    if (!newStream)
        return 0;

    Janitor<BinInputStream>   streamJanitor(newStream);

    //
    //  Create a new reader and return it. If the source has an encoding that
    //  it wants to force, then we call the constructor that does that.
    //  Otherwise, we just call the one that provides the provisional encoding
    //  to be possibly updated later by the encoding="" setting.
    //
    XMLReader* retVal = 0;

    // XMLReader ctor invokes refreshRawBuffer() which calls
    // newStream->readBytes().
    // This readBytes() may throw exception, which neither
    // refresRawBuffer(), nor XMLReader ctor catches.
    // We need to handle this exception to avoid leak on newStream.

    try {
		const XMLCh* encoding = src.getEncoding();
		if(encoding == 0)
			encoding = newStream->getEncoding();
        if (encoding)
        {
            retVal = new (fMemoryManager) XMLReader
                (
                src.getPublicId()
                , src.getSystemId()
                , newStream
                , encoding
                , refFrom
                , type
                , source
                , false
                , calcSrcOfs
                , lowWaterMark
                , fXMLVersion
                , fMemoryManager
                );
        }
        else
        {
            retVal = new (fMemoryManager) XMLReader
                (
                src.getPublicId()
                , src.getSystemId()
                , newStream
                , refFrom
                , type
                , source
                , false
                , calcSrcOfs
                , lowWaterMark
                , fXMLVersion
                , fMemoryManager
                );
        }
    }
    catch(const XMLPlatformUtilsException&)
    {
        streamJanitor.release();

        throw;
    }
    catch(const OutOfMemoryException&)
    {
        streamJanitor.release();

        throw;
    }

    assert(retVal);

    streamJanitor.release();

    // Set the next available reader number on this reader
    retVal->setReaderNum(fNextReaderNum++);
    return retVal;
}